

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary.cpp
# Opt level: O1

void __thiscall CBoundary::Print(CBoundary *this,FILE *pFile,int iMode)

{
  if (pFile == (FILE *)0x0) {
    return;
  }
  __assert_fail("FALSE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                ,0xf7,"virtual void CBoundary::Print(FILE *, int)");
}

Assistant:

void CBoundary::Print(FILE *pFile, int iMode)
{
	//print function for debugging/loggin g
	if(pFile==NULL)	return;

	assert(FALSE);

	//switch(iMode){
	//case PRINT_MODE_CGDUMP:
	//	fprintf(pFile,"%s(%3d,%3d,%3d) %.2f\t",GetParent()->IsHorizontal()? "H":"V",X(),Y(),Z(),GetCongestion(GET_MODE_ALL));
	//	break;
	//case PRINT_MODE_RESULT:
	//	fprintf(pFile,"b %d %d %d\t%d\n",X(),Y(),Z(),GetNumWire(GET_MODE_SPECIAL));
	//	break;
	//case PRINT_MODE_OFDUMP:
	//	if(GetOverFlow(GET_MODE_SUM))
	//	{
	//		fprintf(pFile,"bnd(%d,%d,%d): %d OF -%d\n",
	//			X(),Y(),Z(),GetOverFlow(GET_MODE_SUM),GetParent()->m_BoundaryPenalty[(ADDRESS)this]);
	//	}
	//	break;
	//case PRINT_MODE_TEXT:
	//	{
	//		fprintf(pFile,"bnd(%d,%d,%d): %d tracks\t%d max_cap\t%d tag_cap\t%d overflow\n",
	//			X(),Y(),Z(),
	//			GetNumWire(GET_MODE_ALL),
	//			GetParent()->GetCapacity(GET_MODE_MAX),
	//			GetParent()->GetCapacity(GET_MODE_TARGET),
	//			GetOverFlow(GET_MODE_SUM));
	//		fprintf(pFile,"-spnet takes %d tracks\n",GetNumWire(GET_MODE_SPECIAL));

	//		int	iIndex	=	1;

	//		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
	//		{
	//			(*itr)->Print(pFile,iMode);
	//		}
	//	}
	//	break;
	//default:
	//	assert(FALSE);
	//	break;
	//}

	fflush(pFile);
}